

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AlterEntry(DuckTableEntry *this,ClientContext *context,AlterInfo *info)

{
  pointer pCVar1;
  DataTable *this_00;
  CatalogException *this_01;
  InternalException *this_02;
  NotImplementedException *pNVar2;
  long in_RCX;
  SetColumnCommentInfo *comment_on_column_info;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (*(char *)(in_RCX + 9) == '\x01') {
    switch(*(undefined1 *)(in_RCX + 0x71)) {
    case 1:
      RenameColumn(this,context,(RenameColumnInfo *)info);
      break;
    case 2:
      (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                     internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->config).home_directory._M_dataplus)(this,context);
      pCVar1 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
               operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                           *)this);
      ::std::__cxx11::string::_M_assign((string *)&pCVar1->name);
      this_00 = shared_ptr<duckdb::DataTable,_true>::operator->
                          ((shared_ptr<duckdb::DataTable,_true> *)
                           &(context->config).user_variables._M_h._M_bucket_count);
      ::std::__cxx11::string::string((string *)&local_40,(string *)(in_RCX + 0x78));
      DataTable::SetTableName(this_00,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      break;
    case 3:
      AddColumn(this,context,(AddColumnInfo *)info);
      break;
    case 4:
      RemoveColumn(this,context,(RemoveColumnInfo *)info);
      break;
    case 5:
      ChangeColumnType(this,context,(ChangeColumnTypeInfo *)info);
      break;
    case 6:
      SetDefault(this,context,(SetDefaultInfo *)info);
      break;
    case 7:
      if (*(char *)(in_RCX + 0xf8) == '\0') {
        AddForeignKeyConstraint
                  (this,(optional_ptr<duckdb::ClientContext,_true>)context,
                   (AlterForeignKeyInfo *)info);
      }
      else {
        DropForeignKeyConstraint(this,context,(AlterForeignKeyInfo *)info);
      }
      break;
    case 8:
      SetNotNull(this,context,(SetNotNullInfo *)info);
      break;
    case 9:
      DropNotNull(this,context,(DropNotNullInfo *)info);
      break;
    default:
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_60,"Unrecognized alter table type!",&local_61)
      ;
      InternalException::InternalException(this_02,&local_60);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case 0xb:
      AddConstraint(this,context,(AddConstraintInfo *)info);
      break;
    case 0xc:
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,"SET PARTITIONED BY is not supported for DuckDB tables",
                 &local_61);
      NotImplementedException::NotImplementedException(pNVar2,&local_60);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case 0xd:
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,"SET SORTED BY is not supported for DuckDB tables",&local_61);
      NotImplementedException::NotImplementedException(pNVar2,&local_60);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case 0xe:
      AddField(this,context,(AddFieldInfo *)info);
      break;
    case 0xf:
      RemoveField(this,context,(RemoveFieldInfo *)info);
      break;
    case 0x10:
      RenameField(this,context,(RenameFieldInfo *)info);
    }
  }
  else {
    if (*(char *)(in_RCX + 9) != '\b') {
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,"Can only modify table with ALTER TABLE statement",&local_61);
      CatalogException::CatalogException(this_01,&local_60);
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    SetColumnComment(this,context,(SetColumnCommentInfo *)info);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AlterEntry(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);

	// Column comments have a special alter type
	if (info.type == AlterType::SET_COLUMN_COMMENT) {
		auto &comment_on_column_info = info.Cast<SetColumnCommentInfo>();
		return SetColumnComment(context, comment_on_column_info);
	}

	if (info.type != AlterType::ALTER_TABLE) {
		throw CatalogException("Can only modify table with ALTER TABLE statement");
	}
	auto &table_info = info.Cast<AlterTableInfo>();
	switch (table_info.alter_table_type) {
	case AlterTableType::RENAME_COLUMN: {
		auto &rename_info = table_info.Cast<RenameColumnInfo>();
		return RenameColumn(context, rename_info);
	}
	case AlterTableType::RENAME_FIELD: {
		auto &rename_info = table_info.Cast<RenameFieldInfo>();
		return RenameField(context, rename_info);
	}
	case AlterTableType::RENAME_TABLE: {
		auto &rename_info = table_info.Cast<RenameTableInfo>();
		auto copied_table = Copy(context);
		copied_table->name = rename_info.new_table_name;
		storage->SetTableName(rename_info.new_table_name);
		return copied_table;
	}
	case AlterTableType::ADD_COLUMN: {
		auto &add_info = table_info.Cast<AddColumnInfo>();
		return AddColumn(context, add_info);
	}
	case AlterTableType::ADD_FIELD: {
		auto &add_info = table_info.Cast<AddFieldInfo>();
		return AddField(context, add_info);
	}
	case AlterTableType::REMOVE_COLUMN: {
		auto &remove_info = table_info.Cast<RemoveColumnInfo>();
		return RemoveColumn(context, remove_info);
	}
	case AlterTableType::REMOVE_FIELD: {
		auto &remove_info = table_info.Cast<RemoveFieldInfo>();
		return RemoveField(context, remove_info);
	}
	case AlterTableType::SET_DEFAULT: {
		auto &set_default_info = table_info.Cast<SetDefaultInfo>();
		return SetDefault(context, set_default_info);
	}
	case AlterTableType::ALTER_COLUMN_TYPE: {
		auto &change_type_info = table_info.Cast<ChangeColumnTypeInfo>();
		return ChangeColumnType(context, change_type_info);
	}
	case AlterTableType::FOREIGN_KEY_CONSTRAINT: {
		auto &foreign_key_constraint_info = table_info.Cast<AlterForeignKeyInfo>();
		if (foreign_key_constraint_info.type == AlterForeignKeyType::AFT_ADD) {
			return AddForeignKeyConstraint(context, foreign_key_constraint_info);
		} else {
			return DropForeignKeyConstraint(context, foreign_key_constraint_info);
		}
	}
	case AlterTableType::SET_NOT_NULL: {
		auto &set_not_null_info = table_info.Cast<SetNotNullInfo>();
		return SetNotNull(context, set_not_null_info);
	}
	case AlterTableType::DROP_NOT_NULL: {
		auto &drop_not_null_info = table_info.Cast<DropNotNullInfo>();
		return DropNotNull(context, drop_not_null_info);
	}
	case AlterTableType::ADD_CONSTRAINT: {
		auto &add_constraint_info = table_info.Cast<AddConstraintInfo>();
		return AddConstraint(context, add_constraint_info);
	}
	case AlterTableType::SET_PARTITIONED_BY:
		throw NotImplementedException("SET PARTITIONED BY is not supported for DuckDB tables");
	case AlterTableType::SET_SORTED_BY:
		throw NotImplementedException("SET SORTED BY is not supported for DuckDB tables");
	default:
		throw InternalException("Unrecognized alter table type!");
	}
}